

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatTypeRAW.cpp
# Opt level: O2

OperationReturn __thiscall
FormatTypeRAW::GetFileListFromName
          (FormatTypeRAW *this,char *file_path,
          vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_> *file_list)

{
  pointer *this_00;
  bool bVar1;
  OperationReturn OVar2;
  int iVar3;
  pointer text;
  char *in_stack_fffffffffffffe88;
  allocator<char> local_169;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  file_list_1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_148;
  int side;
  int track;
  string filename;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  directory_list;
  string full_path;
  string last_part;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string file_formatted;
  string dir_path;
  string local_50;
  
  bVar1 = IsDirectory(in_stack_fffffffffffffe88);
  if (bVar1) {
    file_list_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    file_list_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    file_list_1.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    GetDirectoryContent(file_path,&file_list_1);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&file_list_1);
LAB_001508f5:
    OVar2 = OK;
  }
  else {
    GetFullPath_abi_cxx11_((char *)0x15090c);
    GetFileFromPath_abi_cxx11_((char *)0x150919);
    if (8 < filename._M_string_length) {
      std::__cxx11::string::substr((ulong)&last_part,(ulong)&filename);
      iVar3 = __isoc99_sscanf(last_part._M_dataplus._M_p,"%i.%i.",&track,&side);
      if (iVar3 == 2) {
        GetDirectoryFromPath_abi_cxx11_((char *)0x15097a);
        directory_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        directory_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        directory_list.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        GetDirectoryContent(dir_path._M_dataplus._M_p,&directory_list);
        std::__cxx11::string::substr((ulong)&file_list_1,(ulong)&full_path);
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"*.*.raw",&local_169)
        ;
        std::operator+(&file_formatted,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &file_list_1,&local_b0);
        std::__cxx11::string::~string((string *)&local_b0);
        std::__cxx11::string::~string((string *)&file_list_1);
        this_00 = &file_list_1.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        for (text = directory_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
            text != directory_list.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish; text = text + 1) {
          std::__cxx11::string::string((string *)&local_50,(string *)&file_formatted);
          bVar1 = MatchTextWithWildcards(text,&local_50);
          std::__cxx11::string::~string((string *)&local_50);
          if (bVar1) {
            file_list_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)&local_148;
            local_148._M_local_buf[0] = '\0';
            file_list_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
            file_list_1.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
            std::__cxx11::string::_M_assign((string *)this_00);
            std::vector<FormatType::TrackItem,_std::allocator<FormatType::TrackItem>_>::push_back
                      (file_list,(value_type *)&file_list_1);
            std::__cxx11::string::~string((string *)this_00);
          }
        }
        std::__cxx11::string::~string((string *)&file_formatted);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&directory_list);
        std::__cxx11::string::~string((string *)&dir_path);
        std::__cxx11::string::~string((string *)&last_part);
        std::__cxx11::string::~string((string *)&filename);
        std::__cxx11::string::~string((string *)&full_path);
        goto LAB_001508f5;
      }
      std::__cxx11::string::~string((string *)&last_part);
    }
    std::__cxx11::string::~string((string *)&filename);
    std::__cxx11::string::~string((string *)&full_path);
    OVar2 = FILE_ERROR;
  }
  return OVar2;
}

Assistant:

FormatTypeRAW::OperationReturn FormatTypeRAW::GetFileListFromName(const char* file_path,
                                                                  std::vector<TrackItem>& file_list)
{
#ifdef __MORPHOS__
   // Todo
   return -1;
#else

#endif

   // If file_path is a directory
   if (IsDirectory(file_path))
   {
      // walk the directory, 
      std::vector<std::string> file_list;
      GetDirectoryContent(file_path, file_list);

      // try to find pattern to get side / track
      // todo
      // fill the vector
   }
   else
   {
      // Otherwise, its a file : build a g�n�ric mask from this file
      std::string full_path = GetFullPath(file_path);
      std::string filename = GetFileFromPath(file_path);

      // Search for side / tracks. Filename should be of the form xxxx[track].[side].raw. Track si 00-41, side 0-1
      // Check last 8 characters
      if (filename.size() > 8)
      {
         std::string last_part = filename.substr(filename.size() - 8, 8);
         int track, side;
         if (sscanf(last_part.c_str(), "%i.%i.", &track, &side) != 2)
         {
            // Pattern not found
            return FILE_ERROR;
         }

         std::string dir_path = GetDirectoryFromPath(file_path);

         std::vector<std::string> directory_list;
         GetDirectoryContent(dir_path.c_str(), directory_list);

         std::string file_formatted = full_path.substr(0, full_path.size() - 8) + std::string("*.*.raw");

         for (auto it = directory_list.begin(); it != directory_list.end(); it++)
         {
            if (MatchTextWithWildcards(*it, file_formatted))
            {
               TrackItem item;
               item.buffer = nullptr;
               item.size = 0;
               item.path = *it;

               file_list.push_back(item);
            }
         }
      }
      else
      {
         // Not a regular RAW.... Will be hard to load !
         return FILE_ERROR;
      }


      // fill the vector
   }
   return OK;
}